

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

char * g_strdup_vprintf(char *format,__va_list_tag *ap)

{
  int iVar1;
  char *pcStack_28;
  int ret;
  char *str_res;
  __va_list_tag *ap_local;
  char *format_local;
  
  pcStack_28 = (char *)0x0;
  str_res = (char *)ap;
  ap_local = (__va_list_tag *)format;
  iVar1 = vasprintf(&stack0xffffffffffffffd8,format,ap);
  if (iVar1 == -1) {
    format_local = (char *)0x0;
  }
  else {
    format_local = pcStack_28;
  }
  return format_local;
}

Assistant:

char *g_strdup_vprintf(const char *format, va_list ap)
{
    char *str_res = NULL;
#ifdef _MSC_VER
    int len = _vscprintf(format, ap);
    if( len < 0 )
        return NULL;
    str_res = (char *)malloc(len+1);
    if(str_res==NULL)
        return NULL;
    vsnprintf(str_res, len+1, format, ap);
#else
    int ret = vasprintf(&str_res, format, ap);
    if (ret == -1) {
        return NULL;
    }
#endif
    return str_res;
}